

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCClusterAniso::energy(VCClusterAniso *this)

{
  long *in_RDI;
  ReturnType RVar1;
  ReturnType RVar2;
  Vector3d zi;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffb8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffc0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffffc8;
  undefined1 local_20 [32];
  
  (**(code **)(*in_RDI + 0x38))(local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
          dot<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
                    (in_stack_ffffffffffffffc0,
                     (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                      *)in_stack_ffffffffffffffb8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return RVar1 - (RVar2 + RVar2);
}

Assistant:

double VCClusterAniso::energy() {
	Vector3d zi = center();
	return zi.dot(sumK * zi) - 2 * zi.dot(sumKPos);
}